

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool clone_ssl_primary_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  CURLcode CVar1;
  char *pcVar2;
  ssl_primary_config *dest_local;
  ssl_primary_config *source_local;
  
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->field_0x69 = dest->field_0x69 & 0xfe | source->field_0x69 & 1;
  dest->field_0x69 = dest->field_0x69 & 0xfd | ((byte)source->field_0x69 >> 1 & 1) << 1;
  dest->field_0x69 = dest->field_0x69 & 0xfb | ((byte)source->field_0x69 >> 2 & 1) << 2;
  dest->field_0x69 = dest->field_0x69 & 0xf7 | ((byte)source->field_0x69 >> 3 & 1) << 3;
  dest->ssl_options = source->ssl_options;
  CVar1 = blobdup(&dest->cert_blob,source->cert_blob);
  if (CVar1 == CURLE_OK) {
    CVar1 = blobdup(&dest->ca_info_blob,source->ca_info_blob);
    if (CVar1 == CURLE_OK) {
      CVar1 = blobdup(&dest->issuercert_blob,source->issuercert_blob);
      if (CVar1 == CURLE_OK) {
        if (source->CApath == (char *)0x0) {
          dest->CApath = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->CApath);
          dest->CApath = pcVar2;
          if (dest->CApath == (char *)0x0) {
            return false;
          }
        }
        if (source->CAfile == (char *)0x0) {
          dest->CAfile = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->CAfile);
          dest->CAfile = pcVar2;
          if (dest->CAfile == (char *)0x0) {
            return false;
          }
        }
        if (source->issuercert == (char *)0x0) {
          dest->issuercert = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->issuercert);
          dest->issuercert = pcVar2;
          if (dest->issuercert == (char *)0x0) {
            return false;
          }
        }
        if (source->clientcert == (char *)0x0) {
          dest->clientcert = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->clientcert);
          dest->clientcert = pcVar2;
          if (dest->clientcert == (char *)0x0) {
            return false;
          }
        }
        if (source->cipher_list == (char *)0x0) {
          dest->cipher_list = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->cipher_list);
          dest->cipher_list = pcVar2;
          if (dest->cipher_list == (char *)0x0) {
            return false;
          }
        }
        if (source->cipher_list13 == (char *)0x0) {
          dest->cipher_list13 = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->cipher_list13);
          dest->cipher_list13 = pcVar2;
          if (dest->cipher_list13 == (char *)0x0) {
            return false;
          }
        }
        if (source->pinned_key == (char *)0x0) {
          dest->pinned_key = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->pinned_key);
          dest->pinned_key = pcVar2;
          if (dest->pinned_key == (char *)0x0) {
            return false;
          }
        }
        if (source->curves == (char *)0x0) {
          dest->curves = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->curves);
          dest->curves = pcVar2;
          if (dest->curves == (char *)0x0) {
            return false;
          }
        }
        if (source->CRLfile == (char *)0x0) {
          dest->CRLfile = (char *)0x0;
        }
        else {
          pcVar2 = (*Curl_cstrdup)(source->CRLfile);
          dest->CRLfile = pcVar2;
          if (dest->CRLfile == (char *)0x0) {
            return false;
          }
        }
        source_local._7_1_ = true;
      }
      else {
        source_local._7_1_ = false;
      }
    }
    else {
      source_local._7_1_ = false;
    }
  }
  else {
    source_local._7_1_ = false;
  }
  return source_local._7_1_;
}

Assistant:

static bool clone_ssl_primary_config(struct ssl_primary_config *source,
                                     struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;
  dest->ssl_options = source->ssl_options;

  CLONE_BLOB(cert_blob);
  CLONE_BLOB(ca_info_blob);
  CLONE_BLOB(issuercert_blob);
  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(issuercert);
  CLONE_STRING(clientcert);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);
  CLONE_STRING(pinned_key);
  CLONE_STRING(curves);
  CLONE_STRING(CRLfile);
#ifdef USE_TLS_SRP
  CLONE_STRING(username);
  CLONE_STRING(password);
#endif

  return TRUE;
}